

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O1

void PHYSFS_utf8ToUcs2(char *src,PHYSFS_uint16 *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint32 PVar1;
  PHYSFS_uint16 PVar2;
  PHYSFS_uint32 PVar3;
  ulong uVar4;
  char *local_28;
  
  uVar4 = len - 2;
  local_28 = src;
  do {
    if (uVar4 < 2) break;
    PVar1 = __PHYSFS_utf8codepoint(&local_28);
    if (PVar1 != 0) {
      PVar3 = PVar1;
      if (PVar1 == 0xffffffff) {
        PVar3 = 0x3f;
      }
      PVar2 = (PHYSFS_uint16)PVar3;
      if (0xffff < PVar3) {
        PVar2 = 0x3f;
      }
      *dst = PVar2;
      dst = dst + 1;
      uVar4 = uVar4 - 2;
    }
  } while (PVar1 != 0);
  *dst = 0;
  return;
}

Assistant:

void PHYSFS_utf8ToUcs2(const char *src, PHYSFS_uint16 *dst, PHYSFS_uint64 len)
{
    len -= sizeof (PHYSFS_uint16);   /* save room for null char. */
    while (len >= sizeof (PHYSFS_uint16))
    {
        PHYSFS_uint32 cp = __PHYSFS_utf8codepoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* UTF-16 surrogates (bogus chars in UCS-2) */
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        *(dst++) = cp;
        len -= sizeof (PHYSFS_uint16);
    } /* while */

    *dst = 0;
}